

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O2

void Abc_BufAddToQue(Buf_Man_t *p,Abc_Obj_t *pObj)

{
  int v;
  int iVar1;
  Vec_Que_t *p_00;
  int *piVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  
  iVar3 = (pObj->vFanouts).nSize;
  if ((p->nFanMin <= iVar3) &&
     ((p->fBufPis != 0 || ((uVar5 = *(uint *)&pObj->field_0x14 & 0xf, uVar5 != 2 && (uVar5 != 5)))))
     ) {
    v = pObj->Id;
    lVar6 = (long)v;
    if ((lVar6 < 0) || (p->vCounts->nSize <= v)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                    ,0x184,"void Vec_FltWriteEntry(Vec_Flt_t *, int, float)");
    }
    p->vCounts->pArray[lVar6] = (float)iVar3;
    p_00 = p->vQue;
    iVar3 = p_00->nCap;
    if ((iVar3 <= v) || (p_00->pOrder[lVar6] < 0)) {
      if (iVar3 <= p_00->nSize) {
        iVar4 = p_00->nSize + 1;
        iVar1 = iVar3 * 2;
        if (iVar3 * 2 < iVar4) {
          iVar1 = iVar4;
        }
        Vec_QueGrow(p_00,iVar1);
        iVar3 = p_00->nCap;
      }
      if (iVar3 <= v) {
        iVar4 = v + 1;
        iVar1 = iVar3 * 2;
        if (iVar4 != iVar1 && SBORROW4(iVar4,iVar1) == iVar4 + iVar3 * -2 < 0) {
          iVar1 = iVar4;
        }
        Vec_QueGrow(p_00,iVar1);
        iVar3 = p_00->nCap;
      }
      iVar1 = p_00->nSize;
      if (iVar3 <= iVar1) {
        __assert_fail("p->nSize < p->nCap",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xe3,"void Vec_QuePush(Vec_Que_t *, int)");
      }
      if (p_00->pOrder[lVar6] != -1) {
        __assert_fail("p->pOrder[v] == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xe4,"void Vec_QuePush(Vec_Que_t *, int)");
      }
      piVar2 = p_00->pHeap;
      if (piVar2[iVar1] != -1) {
        __assert_fail("p->pHeap[p->nSize] == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xe5,"void Vec_QuePush(Vec_Que_t *, int)");
      }
      p_00->pOrder[lVar6] = iVar1;
      iVar3 = p_00->nSize;
      p_00->nSize = iVar3 + 1;
      piVar2[iVar3] = v;
      Vec_QueMoveUp(p_00,v);
      return;
    }
    iVar3 = Vec_QueMoveUp(p_00,v);
    if (iVar3 == 0) {
      Vec_QueMoveDown(p_00,v);
      return;
    }
  }
  return;
}

Assistant:

void Abc_BufAddToQue( Buf_Man_t * p, Abc_Obj_t * pObj )
{
    if ( Abc_ObjFanoutNum(pObj) < p->nFanMin || (!p->fBufPis && Abc_ObjIsCi(pObj)) )
        return;
    Vec_FltWriteEntry( p->vCounts, Abc_ObjId(pObj), Abc_ObjFanoutNum(pObj) );
    if ( Vec_QueIsMember(p->vQue, Abc_ObjId(pObj)) )
        Vec_QueUpdate( p->vQue, Abc_ObjId(pObj) );
    else
        Vec_QuePush( p->vQue, Abc_ObjId(pObj) );
}